

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_indset_inline.hpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::indset::iteration<Omega_h::QualityCompare>
          (indset *this,Mesh *mesh,Int dim,LOs *xadj,LOs *adj,Read<signed_char> *old_state,
          QualityCompare compare)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> WStack_98;
  Write<signed_char> local_88;
  Write<int> local_78;
  Write<int> local_68;
  Read<signed_char> local_state;
  QualityCompare local_48;
  
  Write<int>::Write(&local_68,&xadj->write_);
  Write<int>::Write(&local_78,&adj->write_);
  Write<signed_char>::Write(&local_88,&old_state->write_);
  QualityCompare::QualityCompare
            (&local_48,(QualityCompare *)compare.quality.write_.shared_alloc_.alloc);
  local_iteration<Omega_h::QualityCompare>
            ((indset *)&local_state,(LOs *)&local_68,(LOs *)&local_78,(Read<signed_char> *)&local_88
             ,&local_48);
  QualityCompare::~QualityCompare(&local_48);
  Write<signed_char>::~Write(&local_88);
  Write<int>::~Write(&local_78);
  Write<int>::~Write(&local_68);
  Write<signed_char>::Write(&WStack_98,&local_state.write_);
  Omega_h::Mesh::sync_array<signed_char>
            ((Mesh *)this,(Int)mesh,(Read<signed_char> *)(ulong)(uint)dim,(Int)&WStack_98);
  Write<signed_char>::~Write(&WStack_98);
  Write<signed_char>::~Write(&local_state.write_);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> iteration(Mesh* mesh, Int dim, LOs xadj, LOs adj, Read<I8> old_state,
    Compare compare) {
  auto local_state = local_iteration(xadj, adj, old_state, compare);
  auto synced_state = mesh->sync_array(dim, local_state, 1);
  return synced_state;
}